

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

int __thiscall AliHttpRequest::ReadResponseBody(AliHttpRequest *this,string *body)

{
  uint uVar1;
  char read_buf [4096];
  char acStack_1028 [4104];
  
  memset(acStack_1028,0,0x1000);
  while ((this->is_response_complete == false && ((this->parser_->field_0x17 & 0x7f) == 0))) {
    uVar1 = (*this->connection_->_vptr_AliConnection[2])(this->connection_,acStack_1028,0x1000);
    if ((int)uVar1 < 1) break;
    http_parser_execute_(this->parser_,&htp_hooks,acStack_1028,(ulong)uVar1);
  }
  std::__cxx11::string::_M_assign((string *)body);
  (this->resposne_body_)._M_string_length = 0;
  *(this->resposne_body_)._M_dataplus._M_p = '\0';
  return (int)body->_M_string_length;
}

Assistant:

int AliHttpRequest::ReadResponseBody(std::string& body) {
  char read_buf[4096] = {};
  int last_Read = 0;
  while(!this->is_response_complete && parser_->http_errno == 0) {
    last_Read = this->connection_->Read(read_buf, sizeof(read_buf));
    if(last_Read <= 0) {
      goto out;
    }
    http_parser_execute_(parser_, &htp_hooks, read_buf, last_Read);
  } 
  
out:
  body = this->resposne_body_;
  ALI_LOG("read result:\n%s", body.c_str());
  this->resposne_body_.clear();
  return body.size();
}